

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O0

Vec_Ptr_t * Llb_NonlinBuildBdds(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper,DdManager *dd)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  DdNode *pDVar4;
  Aig_Obj_t *pAVar5;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  int local_68;
  int local_64;
  int k;
  int i;
  DdNode *bProd;
  DdNode *bBdd1;
  DdNode *bBdd0;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vResult;
  Vec_Ptr_t *vNodes;
  DdManager *dd_local;
  Vec_Ptr_t *vUpper_local;
  Vec_Ptr_t *vLower_local;
  Aig_Man_t *p_local;
  
  pDVar4 = Cudd_ReadOne(dd);
  pAVar5 = Aig_ManConst1(p);
  (pAVar5->field_5).pData = pDVar4;
  for (local_64 = 0; iVar2 = Vec_PtrSize(vLower), local_64 < iVar2; local_64 = local_64 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vLower,local_64);
    iVar2 = Aig_ObjId(pAVar5);
    pDVar4 = Cudd_bddIthVar(dd,iVar2);
    (pAVar5->field_5).pData = pDVar4;
  }
  p_00 = Llb_NonlinCutNodes(p,vLower,vUpper);
  local_64 = 0;
  while( true ) {
    iVar2 = Vec_PtrSize(p_00);
    if (iVar2 <= local_64) {
      p_01 = Vec_PtrAlloc(100);
      local_64 = 0;
      do {
        iVar2 = Vec_PtrSize(vUpper);
        if (iVar2 <= local_64) {
          for (local_64 = 0; iVar2 = Vec_PtrSize(p_00), local_64 < iVar2; local_64 = local_64 + 1) {
            pvVar7 = Vec_PtrEntry(p_00,local_64);
            Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar7 + 0x28));
          }
          Vec_PtrFree(p_00);
          return p_01;
        }
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(vUpper,local_64);
        iVar2 = Aig_ObjIsNode(pAVar5);
        if (iVar2 == 0) {
          iVar2 = Saig_ObjIsLi(p,pAVar5);
          if (iVar2 == 0) {
            __assert_fail("Saig_ObjIsLi(p, pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                          ,0x244,
                          "Vec_Ptr_t *Llb_NonlinBuildBdds(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, DdManager *)"
                         );
          }
          pAVar6 = Aig_ObjFanin0(pAVar5);
          pvVar7 = (pAVar6->field_5).pData;
          iVar2 = Aig_ObjFaninC0(pAVar5);
          iVar3 = Aig_ObjId(pAVar5);
          pDVar4 = Cudd_bddIthVar(dd,iVar3);
          _k = Cudd_bddXnor(dd,pDVar4,(DdNode *)((ulong)pvVar7 ^ (long)iVar2));
          Cudd_Ref(_k);
        }
        else {
          iVar2 = Aig_ObjId(pAVar5);
          pDVar4 = Cudd_bddIthVar(dd,iVar2);
          _k = Cudd_bddXnor(dd,pDVar4,(DdNode *)(pAVar5->field_5).pData);
          Cudd_Ref(_k);
        }
        Vec_PtrPush(p_01,_k);
        local_64 = local_64 + 1;
      } while( true );
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_64);
    pAVar6 = Aig_ObjFanin0(pAVar5);
    pvVar7 = (pAVar6->field_5).pData;
    iVar2 = Aig_ObjFaninC0(pAVar5);
    pAVar6 = Aig_ObjFanin1(pAVar5);
    pvVar1 = (pAVar6->field_5).pData;
    iVar3 = Aig_ObjFaninC1(pAVar5);
    pDVar4 = Cudd_bddAnd(dd,(DdNode *)((ulong)pvVar7 ^ (long)iVar2),
                         (DdNode *)((ulong)pvVar1 ^ (long)iVar3));
    (pAVar5->field_5).pData = pDVar4;
    if ((pAVar5->field_5).pData == (void *)0x0) break;
    Cudd_Ref((DdNode *)(pAVar5->field_5).pData);
    local_64 = local_64 + 1;
  }
  for (local_68 = 0; local_68 < local_64; local_68 = local_68 + 1) {
    pvVar7 = Vec_PtrEntry(p_00,local_68);
    if (*(long *)((long)pvVar7 + 0x28) != 0) {
      Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar7 + 0x28));
    }
  }
  Vec_PtrFree(p_00);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Llb_NonlinBuildBdds( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper, DdManager * dd )
{
    Vec_Ptr_t * vNodes, * vResult;
    Aig_Obj_t * pObj;
    DdNode * bBdd0, * bBdd1, * bProd;
    int i, k;

    Aig_ManConst1(p)->pData = Cudd_ReadOne( dd );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Aig_ObjId(pObj) );

    vNodes = Llb_NonlinCutNodes( p, vLower, vUpper );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Extra_bddAndTime( dd, bBdd0, bBdd1, TimeOut );
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( pObj->pData == NULL )
        {
            Vec_PtrForEachEntryStop( Aig_Obj_t *, vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }

    vResult = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
        {
            bProd = Cudd_bddXnor( dd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)), (DdNode *)pObj->pData );  Cudd_Ref( bProd );
        }
        else
        {
            assert( Saig_ObjIsLi(p, pObj) );
            bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
            bProd = Cudd_bddXnor( dd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)), bBdd0 );                  Cudd_Ref( bProd );
        }
        Vec_PtrPush( vResult, bProd );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );

    Vec_PtrFree( vNodes );
    return vResult;
}